

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorTiledBox.cpp
# Opt level: O2

void __thiscall
Rml::DecoratorTiledBoxInstancer::DecoratorTiledBoxInstancer(DecoratorTiledBoxInstancer *this)

{
  String SStack_58;
  allocator<char> local_32;
  allocator<char> local_31;
  String local_30;
  
  DecoratorTiledInstancer::DecoratorTiledInstancer(&this->super_DecoratorTiledInstancer,9);
  (this->super_DecoratorTiledInstancer).super_DecoratorInstancer._vptr_DecoratorInstancer =
       (_func_int **)&PTR__DecoratorTiledBoxInstancer_00397238;
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&SStack_58,"top-left-image",(allocator<char> *)&local_30);
  DecoratorTiledInstancer::RegisterTileProperty
            (&this->super_DecoratorTiledInstancer,&SStack_58,false);
  ::std::__cxx11::string::~string((string *)&SStack_58);
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&SStack_58,"top-right-image",(allocator<char> *)&local_30);
  DecoratorTiledInstancer::RegisterTileProperty
            (&this->super_DecoratorTiledInstancer,&SStack_58,false);
  ::std::__cxx11::string::~string((string *)&SStack_58);
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&SStack_58,"bottom-left-image",(allocator<char> *)&local_30);
  DecoratorTiledInstancer::RegisterTileProperty
            (&this->super_DecoratorTiledInstancer,&SStack_58,false);
  ::std::__cxx11::string::~string((string *)&SStack_58);
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&SStack_58,"bottom-right-image",(allocator<char> *)&local_30);
  DecoratorTiledInstancer::RegisterTileProperty
            (&this->super_DecoratorTiledInstancer,&SStack_58,false);
  ::std::__cxx11::string::~string((string *)&SStack_58);
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&SStack_58,"left-image",(allocator<char> *)&local_30);
  DecoratorTiledInstancer::RegisterTileProperty
            (&this->super_DecoratorTiledInstancer,&SStack_58,false);
  ::std::__cxx11::string::~string((string *)&SStack_58);
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&SStack_58,"right-image",(allocator<char> *)&local_30);
  DecoratorTiledInstancer::RegisterTileProperty
            (&this->super_DecoratorTiledInstancer,&SStack_58,false);
  ::std::__cxx11::string::~string((string *)&SStack_58);
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&SStack_58,"top-image",(allocator<char> *)&local_30);
  DecoratorTiledInstancer::RegisterTileProperty
            (&this->super_DecoratorTiledInstancer,&SStack_58,false);
  ::std::__cxx11::string::~string((string *)&SStack_58);
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&SStack_58,"bottom-image",(allocator<char> *)&local_30);
  DecoratorTiledInstancer::RegisterTileProperty
            (&this->super_DecoratorTiledInstancer,&SStack_58,false);
  ::std::__cxx11::string::~string((string *)&SStack_58);
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&SStack_58,"center-image",(allocator<char> *)&local_30);
  DecoratorTiledInstancer::RegisterTileProperty
            (&this->super_DecoratorTiledInstancer,&SStack_58,false);
  ::std::__cxx11::string::~string((string *)&SStack_58);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&SStack_58,"decorator",&local_31);
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,
             "top-left-image, top-image, top-right-image, left-image, center-image, right-image, bottom-left-image, bottom-image, bottom-right-image"
             ,&local_32);
  EffectSpecification::RegisterShorthand
            (&(this->super_DecoratorTiledInstancer).super_DecoratorInstancer.
              super_EffectSpecification,&SStack_58,&local_30,RecursiveCommaSeparated);
  ::std::__cxx11::string::~string((string *)&local_30);
  ::std::__cxx11::string::~string((string *)&SStack_58);
  return;
}

Assistant:

DecoratorTiledBoxInstancer::DecoratorTiledBoxInstancer() : DecoratorTiledInstancer(9)
{
	RegisterTileProperty("top-left-image");
	RegisterTileProperty("top-right-image");
	RegisterTileProperty("bottom-left-image");
	RegisterTileProperty("bottom-right-image");

	RegisterTileProperty("left-image");
	RegisterTileProperty("right-image");
	RegisterTileProperty("top-image");
	RegisterTileProperty("bottom-image");

	RegisterTileProperty("center-image");

	RegisterShorthand("decorator",
		"top-left-image, top-image, top-right-image, left-image, center-image, right-image, bottom-left-image, bottom-image, bottom-right-image",
		ShorthandType::RecursiveCommaSeparated);
}